

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

JavascriptArray *
Js::JavascriptArray::Jit_GetArrayForArrayOrObjectWithArray(Var var,bool *isObjectWithArrayRef)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptArray *pJVar4;
  JavascriptArray *local_30;
  long local_28;
  INT_PTR vtable;
  
  if (var == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x259,"(var)","var");
    if (!bVar2) goto LAB_00a3fa2c;
    *puVar3 = 0;
  }
  if (isObjectWithArrayRef == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x25a,"(isObjectWithArrayRef)","isObjectWithArrayRef");
    if (!bVar2) {
LAB_00a3fa2c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  *isObjectWithArrayRef = false;
  bVar2 = VarIs<Js::RecyclableObject>(var);
  if (bVar2) {
    local_30 = (JavascriptArray *)0x0;
    local_28 = *var;
    bVar2 = Jit_TryGetArrayForObjectWithArray(var,isObjectWithArrayRef,&local_28,&local_30);
    if ((bVar2) &&
       ((((local_28 == VirtualTableInfo<Js::JavascriptArray>::Address ||
          (local_28 == VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptArray>_>::Address)) ||
         (local_28 == VirtualTableInfo<Js::JavascriptNativeIntArray>::Address)) ||
        (((local_28 == VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptNativeIntArray>_>::Address
          || (local_28 == VirtualTableInfo<Js::JavascriptNativeFloatArray>::Address)) ||
         (local_28 ==
          VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptNativeFloatArray>_>::Address)))))) {
      if (local_30 != (JavascriptArray *)0x0) {
        return local_30;
      }
      pJVar4 = VarTo<Js::JavascriptArray>(var);
      return pJVar4;
    }
  }
  return (JavascriptArray *)0x0;
}

Assistant:

JavascriptArray *JavascriptArray::Jit_GetArrayForArrayOrObjectWithArray(const Var var, bool *const isObjectWithArrayRef)
    {
        Assert(var);
        Assert(isObjectWithArrayRef);

        *isObjectWithArrayRef = false;

        if (!VarIs<RecyclableObject>(var))
        {
            return nullptr;
        }

        JavascriptArray *array = nullptr;
        INT_PTR vtable = VirtualTableInfoBase::GetVirtualTable(var);
        if (!Jit_TryGetArrayForObjectWithArray(var, isObjectWithArrayRef, &vtable, &array))
        {
            return nullptr;
        }

        if (vtable != VirtualTableInfo<JavascriptArray>::Address &&
            vtable != VirtualTableInfo<CrossSiteObject<JavascriptArray>>::Address &&
            vtable != VirtualTableInfo<JavascriptNativeIntArray>::Address &&
            vtable != VirtualTableInfo<CrossSiteObject<JavascriptNativeIntArray>>::Address &&
            vtable != VirtualTableInfo<JavascriptNativeFloatArray>::Address &&
            vtable != VirtualTableInfo<CrossSiteObject<JavascriptNativeFloatArray>>::Address)
        {
            return nullptr;
        }

        if (!array)
        {
            array = VarTo<JavascriptArray>(var);
        }
        return array;
    }